

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3TableAffinity(Vdbe *v,Table *pTab,int iReg)

{
  sqlite3 *psVar1;
  int addr;
  char *__s;
  long lVar2;
  size_t sVar3;
  long lVar4;
  uint p2;
  
  __s = pTab->zColAff;
  if (__s == (char *)0x0) {
    psVar1 = v->db;
    __s = (char *)sqlite3Malloc((long)pTab->nCol + 1);
    if (__s == (char *)0x0) {
      if ((psVar1->mallocFailed == '\0') && (psVar1->bBenignMalloc == '\0')) {
        psVar1->mallocFailed = '\x01';
        if (0 < psVar1->nVdbeExec) {
          (psVar1->u1).isInterrupted = 1;
        }
        (psVar1->lookaside).bDisable = (psVar1->lookaside).bDisable + 1;
      }
    }
    else {
      if (pTab->nCol < 1) {
        lVar2 = 0;
      }
      else {
        lVar4 = 0x19;
        lVar2 = 0;
        do {
          __s[lVar2] = *(char *)((long)&pTab->aCol->zName + lVar4);
          lVar2 = lVar2 + 1;
          lVar4 = lVar4 + 0x20;
        } while (lVar2 < pTab->nCol);
      }
      do {
        __s[lVar2] = '\0';
        if (lVar2 < 1) break;
        lVar4 = lVar2 + -1;
        lVar2 = lVar2 + -1;
      } while (__s[lVar4] == 'A');
      pTab->zColAff = __s;
    }
    if (__s == (char *)0x0) {
      return;
    }
  }
  sVar3 = strlen(__s);
  p2 = (uint)sVar3 & 0x3fffffff;
  if ((sVar3 & 0x3fffffff) == 0) {
    return;
  }
  if (iReg == 0) {
    addr = -1;
  }
  else {
    addr = sqlite3VdbeAddOp3(v,0x62,iReg,p2,0);
  }
  sqlite3VdbeChangeP4(v,addr,__s,p2);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3TableAffinity(Vdbe *v, Table *pTab, int iReg){
  int i;
  char *zColAff = pTab->zColAff;
  if( zColAff==0 ){
    sqlite3 *db = sqlite3VdbeDb(v);
    zColAff = (char *)sqlite3DbMallocRaw(0, pTab->nCol+1);
    if( !zColAff ){
      sqlite3OomFault(db);
      return;
    }

    for(i=0; i<pTab->nCol; i++){
      zColAff[i] = pTab->aCol[i].affinity;
    }
    do{
      zColAff[i--] = 0;
    }while( i>=0 && zColAff[i]==SQLITE_AFF_BLOB );
    pTab->zColAff = zColAff;
  }
  i = sqlite3Strlen30(zColAff);
  if( i ){
    if( iReg ){
      sqlite3VdbeAddOp4(v, OP_Affinity, iReg, i, 0, zColAff, i);
    }else{
      sqlite3VdbeChangeP4(v, -1, zColAff, i);
    }
  }
}